

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

bool __thiscall
kj::anon_unknown_8::DiskHandle::ReplacerImpl<kj::Directory>::tryCommit
          (ReplacerImpl<kj::Directory> *this)

{
  size_t sVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  StringPtr toPath;
  StringPtr fromPath;
  Fault f;
  
  if (this->committed == true) {
    bVar2 = false;
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[18]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x4ef,FAILED,"!committed","\"already committed\"",(char (*) [18])"already committed"
              );
    _::Debug::Fault::~Fault(&f);
  }
  else {
    sVar1 = (this->path).content.size_;
    pcVar4 = "";
    pcVar3 = "";
    if (sVar1 != 0) {
      pcVar3 = (this->path).content.ptr;
    }
    toPath.content.size_ = sVar1 + (sVar1 == 0);
    sVar1 = (this->tempPath).content.size_;
    if (sVar1 != 0) {
      pcVar4 = (this->tempPath).content.ptr;
    }
    fromPath.content.size_ = sVar1 + (sVar1 == 0);
    toPath.content.ptr = pcVar3;
    fromPath.content.ptr = pcVar4;
    bVar2 = tryCommitReplacement
                      (this->handle,toPath,(this->handle->fd).fd,fromPath,
                       (this->super_Replacer<kj::Directory>).mode,(int *)0x0);
    this->committed = bVar2;
  }
  return bVar2;
}

Assistant:

bool tryCommit() override {
      KJ_ASSERT(!committed, "already committed") { return false; }
      return committed = handle.tryCommitReplacement(path, handle.fd, tempPath,
                                                     Directory::Replacer<T>::mode);
    }